

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnnotatedStringTests.cpp
# Opt level: O2

bool agge::operator==(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *expected,range *actual)

{
  pointer pcVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (((actual->
             super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )._container)->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_38,
             pcVar1 + (actual->
                      super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).begin_index,
             pcVar1 + (actual->
                      super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).end_index);
  _Var2 = std::operator==(&expected->first,&local_38);
  if (_Var2) {
    _Var2 = std::operator==(&expected->second,actual->_annotation);
  }
  else {
    _Var2 = false;
  }
  std::__cxx11::string::~string((string *)&local_38);
  return _Var2;
}

Assistant:

inline bool operator ==(const pair<basic_string<T>, AnnotationT> &expected,
		const typename annotated_string<T, AnnotationT>::range &actual)
	{
		return expected.first == basic_string<T>(actual.begin(), actual.end())
			&& expected.second == actual.get_annotation();
	}